

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h
# Opt level: O2

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZQuadraticLine>::MidSideNodeIndex
          (TPZGeoElRefPattern<pzgeom::TPZQuadraticLine> *this,int side,int64_t *index)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int64_t iVar5;
  ostream *poVar6;
  TPZGeoNode *pTVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  REAL RVar12;
  REAL RVar13;
  TPZVec<double> auxpt;
  TPZVec<double> centerpt;
  TPZStack<long,_10> msnindex;
  TPZStack<TPZGeoElSide,_10> subels;
  double local_210;
  double local_200;
  TPZVec<double> local_1f8;
  TPZVec<double> local_1d8;
  double local_1b8;
  TPZManVector<long,_10> local_1b0;
  TPZStack<TPZGeoElSide,_10> local_140;
  
  *index = -1;
  if (-1 < side) {
    iVar2 = (**(code **)(*(long *)&(this->super_TPZGeoElRefLess<pzgeom::TPZQuadraticLine>).
                                   super_TPZGeoEl + 0xf0))();
    if (side < iVar2) {
      iVar2 = (**(code **)(*(long *)&(this->super_TPZGeoElRefLess<pzgeom::TPZQuadraticLine>).
                                     super_TPZGeoEl + 0x98))(this);
      lVar9 = *(long *)&(this->super_TPZGeoElRefLess<pzgeom::TPZQuadraticLine>).super_TPZGeoEl;
      if (side < iVar2) {
        iVar5 = (**(code **)(lVar9 + 0xa8))(this,side);
        *index = iVar5;
      }
      else {
        iVar2 = (**(code **)(lVar9 + 0x1d0))(this);
        if (iVar2 != 0) {
          uVar3 = (**(code **)(*(long *)&(this->super_TPZGeoElRefLess<pzgeom::TPZQuadraticLine>).
                                         super_TPZGeoEl + 0x150))(this,side);
          TPZStack<TPZGeoElSide,_10>::TPZStack(&local_140);
          (**(code **)(*(long *)&(this->super_TPZGeoElRefLess<pzgeom::TPZQuadraticLine>).
                                 super_TPZGeoEl + 0x268))(this,side,&local_140);
          if (uVar3 == 1) {
            (**(code **)(*(long *)(local_140.super_TPZManVector<TPZGeoElSide,_10>.
                                   super_TPZVec<TPZGeoElSide>.fStore)->fGeoEl + 0x118))
                      ((local_140.super_TPZManVector<TPZGeoElSide,_10>.super_TPZVec<TPZGeoElSide>.
                       fStore)->fGeoEl,
                       (local_140.super_TPZManVector<TPZGeoElSide,_10>.super_TPZVec<TPZGeoElSide>.
                       fStore)->fSide,index);
          }
          else {
            TPZStack<long,_10>::TPZStack((TPZStack<long,_10> *)&local_1b0);
            uVar8 = 0;
            uVar10 = (ulong)uVar3;
            if ((int)uVar3 < 1) {
              uVar10 = uVar8;
            }
            for (; uVar10 * 0x18 - uVar8 != 0; uVar8 = uVar8 + 0x18) {
              iVar2 = *(int *)((long)&(local_140.super_TPZManVector<TPZGeoElSide,_10>.
                                       super_TPZVec<TPZGeoElSide>.fStore)->fSide + uVar8);
              iVar4 = (**(code **)(**(long **)((long)&(local_140.
                                                       super_TPZManVector<TPZGeoElSide,_10>.
                                                       super_TPZVec<TPZGeoElSide>.fStore)->fGeoEl +
                                              uVar8) + 0x98))();
              if (iVar2 < iVar4) {
                iVar5 = TPZGeoElSide::SideNodeIndex
                                  ((TPZGeoElSide *)
                                   ((long)&((local_140.super_TPZManVector<TPZGeoElSide,_10>.
                                             super_TPZVec<TPZGeoElSide>.fStore)->super_TPZSavable).
                                           _vptr_TPZSavable + uVar8),0);
                TPZStack<long,_10>::Push((TPZStack<long,_10> *)&local_1b0,iVar5);
              }
            }
            if (1 < local_1b0.super_TPZVec<long>.fNElements) {
              poVar6 = std::operator<<((ostream *)&std::cout,
                                       "TPZGeoElRefPattern<TGeo>::MidSideNodeIndex element with more than one midsidenodeindex..."
                                      );
              std::endl<char,std::char_traits<char>>(poVar6);
            }
            if (local_1b0.super_TPZVec<long>.fNElements == 0) {
              *index = -1;
            }
            else if (local_1b0.super_TPZVec<long>.fNElements == 1) {
              *index = *local_1b0.super_TPZVec<long>.fStore;
            }
            else {
              iVar2 = (**(code **)(*(long *)&(this->super_TPZGeoElRefLess<pzgeom::TPZQuadraticLine>)
                                             .super_TPZGeoEl + 0x210))(this);
              local_1f8._vptr_TPZVec = (_func_int **)0x0;
              TPZVec<double>::TPZVec(&local_1d8,(long)iVar2,(double *)&local_1f8);
              iVar2 = (**(code **)(*(long *)&(this->super_TPZGeoElRefLess<pzgeom::TPZQuadraticLine>)
                                             .super_TPZGeoEl + 0x210))(this);
              local_1b8 = 0.0;
              TPZVec<double>::TPZVec(&local_1f8,(long)iVar2,&local_1b8);
              (**(code **)(*(long *)&(this->super_TPZGeoElRefLess<pzgeom::TPZQuadraticLine>).
                                     super_TPZGeoEl + 0x260))(this,side,&local_1f8);
              (**(code **)(*(long *)&(this->super_TPZGeoElRefLess<pzgeom::TPZQuadraticLine>).
                                     super_TPZGeoEl + 0x228))(this,&local_1f8,&local_1d8);
              *index = *local_1b0.super_TPZVec<long>.fStore;
              local_210 = 0.0;
              local_200 = 1000000.0;
              for (lVar9 = 0; lVar9 < local_1b0.super_TPZVec<long>.fNElements; lVar9 = lVar9 + 1) {
                lVar11 = 0;
                while( true ) {
                  iVar2 = (**(code **)(*(long *)&(this->
                                                 super_TPZGeoElRefLess<pzgeom::TPZQuadraticLine>).
                                                 super_TPZGeoEl + 0x210))(this);
                  if (iVar2 <= lVar11) break;
                  pTVar7 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                                     (&(((this->super_TPZGeoElRefLess<pzgeom::TPZQuadraticLine>).
                                         super_TPZGeoEl.fMesh)->fNodeVec).
                                       super_TPZChunkVector<TPZGeoNode,_10>,
                                      local_1b0.super_TPZVec<long>.fStore[lVar9]);
                  RVar12 = TPZGeoNode::Coord(pTVar7,(int)lVar11);
                  dVar1 = local_1d8.fStore[lVar11];
                  pTVar7 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                                     (&(((this->super_TPZGeoElRefLess<pzgeom::TPZQuadraticLine>).
                                         super_TPZGeoEl.fMesh)->fNodeVec).
                                       super_TPZChunkVector<TPZGeoNode,_10>,
                                      local_1b0.super_TPZVec<long>.fStore[lVar9]);
                  RVar13 = TPZGeoNode::Coord(pTVar7,(int)lVar11);
                  local_210 = local_210 + (RVar12 - dVar1) * (RVar13 - local_1d8.fStore[lVar11]);
                  lVar11 = lVar11 + 1;
                }
                if (local_210 < local_200) {
                  *index = local_1b0.super_TPZVec<long>.fStore[lVar9];
                  local_200 = local_210;
                }
              }
              TPZVec<double>::~TPZVec(&local_1f8);
              TPZVec<double>::~TPZVec(&local_1d8);
            }
            TPZManVector<long,_10>::~TPZManVector(&local_1b0);
          }
          TPZManVector<TPZGeoElSide,_10>::~TPZManVector
                    (&local_140.super_TPZManVector<TPZGeoElSide,_10>);
        }
      }
      return;
    }
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,
                           "TPZGeoElRefPattern::MidSideNodeIndex. Bad parameter side = ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,side);
  std::endl<char,std::char_traits<char>>(poVar6);
  return;
}

Assistant:

void TPZGeoElRefPattern<TGeo>::MidSideNodeIndex(int side,int64_t &index) const {
	index = -1;
	int i,j;
	if(side<0 || side>this->NSides()-1) {
		PZError << "TPZGeoElRefPattern::MidSideNodeIndex. Bad parameter side = " << side << std::endl;
		return;
	}
	//corner side
	if(side<this->NCornerNodes()) {//o n�medio do lado 0 �o 0 etc.
		index = this->NodeIndex(side);
		return;
	}
	//o n�medio da face �o centro e o n�medio do centro �o centro
	//como n�de algum filho se este existir
	//caso tenha filhos �o canto de algum filho, se n� tiver filhos retorna -1
	if(HasSubElement()) {
		//side -= NCornerNodes();
		//index =(gel->SubElement(MidSideNodes[side][0]))->NodeIndex(MidSideNodes[side][1]);
		int nsubel = this->NSideSubElements(side);
		TPZStack <TPZGeoElSide> subels;
		GetSubElements2(side,subels);
		// Nao sei porque deve se fazer esta execao
		if (nsubel == 1) {
			subels[0].Element()->MidSideNodeIndex(subels[0].Side(),index);
			return;
		}
		TPZStack <int64_t> msnindex;
		// este sidenodeindex pode nao existir. Normalmente o numero de nos de um elemento e igual
		// NNodes. Quer dizer se o lado e maior igual NNodes, este metodo nao devolvera nada
		
		int64_t subnodeindex;
		for (i=0;i<nsubel;i++){
			if(subels[i].Side() >= subels[i].Element()->NCornerNodes()) continue;
			subnodeindex = subels[i].SideNodeIndex(0);
			msnindex.Push(subnodeindex);
		}
		if(msnindex.NElements() > 1) {
			std::cout << "TPZGeoElRefPattern<TGeo>::MidSideNodeIndex element with more than one midsidenodeindex..." << std::endl;
		}
		if (msnindex.NElements() == 1) index = msnindex[0];
		else if(msnindex.NElements() == 0) {
			index = -1;
		} else {
			TPZVec<REAL> centerpt(this->Dimension(),0.);
			TPZVec<REAL> auxpt(this->Dimension(),0.);
			this->CenterPoint(side,auxpt);
			this->X(auxpt,centerpt);
			
			REAL dif = 1e6;
			REAL aux = 0;
			index = msnindex[0];
			for (i=0;i<msnindex.NElements();i++){
				for (j=0;j<this->Dimension();j++)
					aux += (this->Mesh()->NodeVec()[msnindex[i]].Coord(j) - centerpt[j]) *
                    (this->Mesh()->NodeVec()[msnindex[i]].Coord(j) - centerpt[j]);
				if (aux < dif){
					dif = aux;
					index = msnindex[i];
				}
			}
		}
	}
}